

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareCosDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  uint uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  
  lVar6 = *(longdouble *)x->c_;
  lVar7 = *(longdouble *)y->c_;
  lVar1 = *(longdouble *)(x->c_ + 1);
  lVar2 = *(longdouble *)(y->c_ + 1);
  lVar3 = *(longdouble *)(x->c_ + 2);
  lVar4 = *(longdouble *)(y->c_ + 2);
  sqrtl();
  in_ST0 = (lVar1 * lVar2 + (longdouble)0 + lVar7 * lVar6 + lVar3 * lVar4) / in_ST0;
  lVar6 = (longdouble)1 + r2 * (longdouble)-0.5;
  lVar7 = lVar6 * (longdouble)1.0842022e-19 +
          ABS(in_ST0) * (longdouble)3.7947076e-19 + (longdouble)8.131516e-20;
  in_ST0 = in_ST0 - lVar6;
  uVar5 = 0xffffffff;
  if (in_ST0 <= lVar7) {
    uVar5 = (uint)(in_ST0 < -lVar7);
  }
  return uVar5;
}

Assistant:

int TriageCompareCosDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();
  T cos_xy_error;
  T cos_xy = GetCosDistance(x, y, &cos_xy_error);
  T cos_r = 1 - 0.5 * r2;
  T cos_r_error = 2 * T_ERR * cos_r;
  T diff = cos_xy - cos_r;
  T error = cos_xy_error + cos_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}